

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::TestGroup::init(TestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestCaseGroup *pTVar2;
  Context *pCVar3;
  Context *this_00;
  NumSamplesParams *local_60;
  NumSamplesParams *lp_1;
  TestCaseGroup *sampleTests;
  NumLayersParams *local_30;
  NumLayersParams *lp;
  TestCaseGroup *layerTests;
  TestGroup *this_local;
  
  this_00 = &this->m_fboc;
  pTVar1 = &deqp::gls::fboc::details::Context::createRenderableTests(this_00)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &deqp::gls::fboc::details::Context::createAttachmentTests(this_00)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &deqp::gls::fboc::details::Context::createSizeTests(this_00)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  pCVar3 = TestCaseGroup::getContext(&this->super_TestCaseGroup);
  TestCaseGroup::TestCaseGroup(pTVar2,pCVar3,"layer","Tests for layer attachments");
  for (local_30 = init::s_layersParams; local_30 != (NumLayersParams *)init::s_samplesParams;
      local_30 = local_30 + 1) {
    pTVar1 = (TestNode *)operator_new(0x88);
    NumLayersTest::NumLayersTest((NumLayersTest *)pTVar1,&this->m_fboc,*local_30);
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar1);
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  pCVar3 = TestCaseGroup::getContext(&this->super_TestCaseGroup);
  TestCaseGroup::TestCaseGroup(pTVar2,pCVar3,"samples","Tests for multisample attachments");
  for (local_60 = init::s_samplesParams;
      local_60 != (NumSamplesParams *)"N4deqp5gles310Functional10ES3CheckerE";
      local_60 = local_60 + 1) {
    pTVar1 = (TestNode *)operator_new(0x88);
    NumSamplesTest::NumSamplesTest
              ((NumSamplesTest *)pTVar1,&this->m_fboc,(NumSamplesParams)*&local_60->numSamples);
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar1);
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  return extraout_EAX;
}

Assistant:

void TestGroup::init (void)
{
	addChild(m_fboc.createRenderableTests());
	addChild(m_fboc.createAttachmentTests());
	addChild(m_fboc.createSizeTests());

	TestCaseGroup* layerTests = new TestCaseGroup(
		getContext(), "layer", "Tests for layer attachments");

	static const NumLayersParams s_layersParams[] =
		{ //  textureKind			numLayers	attachmentKind
			{ GL_TEXTURE_2D_ARRAY,	1,			0 },
			{ GL_TEXTURE_2D_ARRAY,	1,			3 },
			{ GL_TEXTURE_2D_ARRAY,	4,			3 },
			{ GL_TEXTURE_2D_ARRAY,	4,			15 },
			{ GL_TEXTURE_3D,		1,			0 },
			{ GL_TEXTURE_3D,		1,			15 },
			{ GL_TEXTURE_3D,		4,			15 },
			{ GL_TEXTURE_3D,		64,			15 },
		};

	for (const NumLayersParams* lp	=	DE_ARRAY_BEGIN(s_layersParams);
		 lp							!=  DE_ARRAY_END(s_layersParams);
		 ++lp)
		layerTests->addChild(new NumLayersTest(m_fboc, *lp));

	addChild(layerTests);

	TestCaseGroup* sampleTests = new TestCaseGroup(
		getContext(), "samples", "Tests for multisample attachments");

	static const NumSamplesParams s_samplesParams[] =
	{
		{ { 0,					SAMPLES_NONE,		SAMPLES_NONE } },
		{ { 1,					SAMPLES_NONE,		SAMPLES_NONE } },
		{ { 2,					SAMPLES_NONE,		SAMPLES_NONE } },
		{ { 0,					SAMPLES_TEXTURE,	SAMPLES_NONE } },
		{ { 1,					SAMPLES_TEXTURE,	SAMPLES_NONE } },
		{ { 2,					SAMPLES_TEXTURE,	SAMPLES_NONE } },
		{ { 2,					1,					SAMPLES_NONE } },
		{ { 2,					2,					SAMPLES_NONE } },
		{ { 0,					0,					SAMPLES_TEXTURE } },
		{ { 1,					2,					0 } },
		{ { 2,					2,					0 } },
		{ { 1,					1,					1 } },
		{ { 1,					2,					4 } },
	};

	for (const NumSamplesParams* lp	=	DE_ARRAY_BEGIN(s_samplesParams);
		 lp							!=  DE_ARRAY_END(s_samplesParams);
		 ++lp)
		sampleTests->addChild(new NumSamplesTest(m_fboc, *lp));

	addChild(sampleTests);
}